

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

Suite * suite_create(char *name)

{
  Suite *pSVar1;
  List *pLVar2;
  Suite *s;
  char *name_local;
  
  pSVar1 = (Suite *)emalloc(0x10);
  if (name == (char *)0x0) {
    pSVar1->name = "";
  }
  else {
    pSVar1->name = name;
  }
  pLVar2 = check_list_create();
  pSVar1->tclst = pLVar2;
  return pSVar1;
}

Assistant:

Suite *suite_create(const char *name)
{
    Suite *s;

    s = (Suite *)emalloc(sizeof(Suite)); /* freed in suite_free */
    if(name == NULL)
        s->name = "";
    else
        s->name = name;
    s->tclst = check_list_create();
    return s;
}